

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

void __thiscall
flatbuffers::cpp::CppGenerator::GenFieldsNumber(CppGenerator *this,StructDef *struct_def)

{
  bool bVar1;
  uint uVar2;
  pointer ppFVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  uint __len;
  ulong uVar6;
  ulong __val;
  string __str;
  long *local_90 [2];
  long local_80 [2];
  key_type local_70;
  string local_50;
  
  uVar6 = 0;
  for (ppFVar3 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar3 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
    uVar6 = uVar6 + ((ulong)(*ppFVar3)->deprecated ^ 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"FIELD_COUNT","");
  __val = -uVar6;
  if (0 < (long)uVar6) {
    __val = uVar6;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0018e9e1;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0018e9e1;
      }
      if (uVar5 < 10000) goto LAB_0018e9e1;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_0018e9e1:
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)((long)uVar6 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_90[0] - ((long)uVar6 >> 0x3f)),__len,__val);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->code_).value_map_,&local_70);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"  static constexpr size_t fields_number = {{FIELD_COUNT}};","");
  CodeWriter::operator+=(&this->code_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenFieldsNumber(const StructDef &struct_def) {
    const auto non_deprecated_field_count = std::count_if(
        struct_def.fields.vec.begin(), struct_def.fields.vec.end(),
        [](const FieldDef *field) { return !field->deprecated; });
    code_.SetValue(
        "FIELD_COUNT",
        std::to_string(static_cast<long long>(non_deprecated_field_count)));
    code_ += "  static constexpr size_t fields_number = {{FIELD_COUNT}};";
  }